

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_start_link_endpoint
              (LINK_ENDPOINT_HANDLE link_endpoint,ON_ENDPOINT_FRAME_RECEIVED frame_received_callback
              ,ON_SESSION_STATE_CHANGED on_session_state_changed,
              ON_SESSION_FLOW_ON on_session_flow_on,void *context)

{
  int local_34;
  int result;
  void *context_local;
  ON_SESSION_FLOW_ON on_session_flow_on_local;
  ON_SESSION_STATE_CHANGED on_session_state_changed_local;
  ON_ENDPOINT_FRAME_RECEIVED frame_received_callback_local;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if ((link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) ||
     (frame_received_callback == (ON_ENDPOINT_FRAME_RECEIVED)0x0)) {
    local_34 = 0x4c1;
  }
  else {
    link_endpoint->frame_received_callback = frame_received_callback;
    link_endpoint->on_session_state_changed = on_session_state_changed;
    link_endpoint->on_session_flow_on = on_session_flow_on;
    link_endpoint->callback_context = context;
    link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_NOT_ATTACHED;
    if (link_endpoint->on_session_state_changed != (ON_SESSION_STATE_CHANGED)0x0) {
      (*link_endpoint->on_session_state_changed)
                (link_endpoint->callback_context,link_endpoint->session->session_state,
                 link_endpoint->session->previous_session_state);
    }
    local_34 = 0;
  }
  return local_34;
}

Assistant:

int session_start_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint, ON_ENDPOINT_FRAME_RECEIVED frame_received_callback, ON_SESSION_STATE_CHANGED on_session_state_changed, ON_SESSION_FLOW_ON on_session_flow_on, void* context)
{
    int result;

    if ((link_endpoint == NULL) ||
        (frame_received_callback == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        link_endpoint->frame_received_callback = frame_received_callback;
        link_endpoint->on_session_state_changed = on_session_state_changed;
        link_endpoint->on_session_flow_on = on_session_flow_on;
        link_endpoint->callback_context = context;
        link_endpoint->link_endpoint_state = LINK_ENDPOINT_STATE_NOT_ATTACHED;

        if (link_endpoint->on_session_state_changed != NULL)
        {
            link_endpoint->on_session_state_changed(link_endpoint->callback_context, link_endpoint->session->session_state, link_endpoint->session->previous_session_state);
        }

        result = 0;
    }

    return result;
}